

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  
  printf("\nTest case:\t%s\n","test_map2json_emptyMap");
  if (argv[1] == (char *)0x0) {
    test_map2json_emptyMap();
  }
  else {
    iVar1 = strcmp(argv[1],"test_map2json_emptyMap");
    if (iVar1 == 0) {
      iVar1 = test_map2json_emptyMap();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_map2json_null");
  if (argv[1] == (char *)0x0) {
    test_map2json_null();
  }
  else {
    iVar1 = strcmp(argv[1],"test_map2json_null");
    if (iVar1 == 0) {
      iVar1 = test_map2json_null();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_map2json_true");
  if (argv[1] == (char *)0x0) {
    test_map2json_true();
  }
  else {
    iVar1 = strcmp(argv[1],"test_map2json_true");
    if (iVar1 == 0) {
      iVar1 = test_map2json_true();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_map2json_false");
  if (argv[1] == (char *)0x0) {
    test_map2json_false();
  }
  else {
    iVar1 = strcmp(argv[1],"test_map2json_false");
    if (iVar1 == 0) {
      iVar1 = test_map2json_false();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_map2json_numberInt");
  if (argv[1] == (char *)0x0) {
    test_map2json_numberInt();
  }
  else {
    iVar1 = strcmp(argv[1],"test_map2json_numberInt");
    if (iVar1 == 0) {
      iVar1 = test_map2json_numberInt();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_map2json_numberFloat");
  if (argv[1] == (char *)0x0) {
    test_map2json_numberFloat();
  }
  else {
    iVar1 = strcmp(argv[1],"test_map2json_numberFloat");
    if (iVar1 == 0) {
      iVar1 = test_map2json_numberFloat();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_map2json_array");
  if (argv[1] == (char *)0x0) {
    test_map2json_array();
  }
  else {
    iVar1 = strcmp(argv[1],"test_map2json_array");
    if (iVar1 == 0) {
      iVar1 = test_map2json_array();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_map2json_primitive");
  if (argv[1] == (char *)0x0) {
    test_map2json_primitive();
  }
  else {
    iVar1 = strcmp(argv[1],"test_map2json_primitive");
    if (iVar1 == 0) {
      iVar1 = test_map2json_primitive();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_map2json_deepNesting");
  if (argv[1] == (char *)0x0) {
    test_map2json_deepNesting();
  }
  else {
    iVar1 = strcmp(argv[1],"test_map2json_deepNesting");
    if (iVar1 == 0) {
      iVar1 = test_map2json_deepNesting();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_map2json_prefix");
  if (argv[1] == (char *)0x0) {
    test_map2json_prefix();
  }
  else {
    iVar1 = strcmp(argv[1],"test_map2json_prefix");
    if (iVar1 == 0) {
      iVar1 = test_map2json_prefix();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_emptyJson");
  if (argv[1] == (char *)0x0) {
    test_json2map_emptyJson();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_emptyJson");
    if (iVar1 == 0) {
      iVar1 = test_json2map_emptyJson();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_null");
  if (argv[1] == (char *)0x0) {
    test_json2map_null();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_null");
    if (iVar1 == 0) {
      iVar1 = test_json2map_null();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_true");
  if (argv[1] == (char *)0x0) {
    test_json2map_true();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_true");
    if (iVar1 == 0) {
      iVar1 = test_json2map_true();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_false");
  if (argv[1] == (char *)0x0) {
    test_json2map_false();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_false");
    if (iVar1 == 0) {
      iVar1 = test_json2map_false();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_numberInt");
  if (argv[1] == (char *)0x0) {
    test_json2map_numberInt();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_numberInt");
    if (iVar1 == 0) {
      iVar1 = test_json2map_numberInt();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_numberFloat");
  if (argv[1] == (char *)0x0) {
    test_json2map_numberFloat();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_numberFloat");
    if (iVar1 == 0) {
      iVar1 = test_json2map_numberFloat();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_array");
  if (argv[1] == (char *)0x0) {
    test_json2map_array();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_array");
    if (iVar1 == 0) {
      iVar1 = test_json2map_array();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_primitive");
  if (argv[1] == (char *)0x0) {
    test_json2map_primitive();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_primitive");
    if (iVar1 == 0) {
      iVar1 = test_json2map_primitive();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_deepNesting");
  if (argv[1] == (char *)0x0) {
    test_json2map_deepNesting();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_deepNesting");
    if (iVar1 == 0) {
      iVar1 = test_json2map_deepNesting();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_jsonNull");
  if (argv[1] == (char *)0x0) {
    test_json2map_jsonNull();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_jsonNull");
    if (iVar1 == 0) {
      iVar1 = test_json2map_jsonNull();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_noDataHook");
  if (argv[1] == (char *)0x0) {
    test_json2map_noDataHook();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_noDataHook");
    if (iVar1 == 0) {
      test_json2map_noDataHook();
      return 0;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_objectHook");
  if (argv[1] == (char *)0x0) {
    test_json2map_objectHook();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_objectHook");
    if (iVar1 == 0) {
      iVar1 = test_json2map_objectHook();
      return iVar1;
    }
  }
  printf("\nTest case:\t%s\n","test_json2map_prefix");
  if (argv[1] == (char *)0x0) {
    test_json2map_prefix();
  }
  else {
    iVar1 = strcmp(argv[1],"test_json2map_prefix");
    if (iVar1 == 0) {
      iVar1 = test_json2map_prefix();
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int main(int argc, char **argv) {
	TESTCALL("test_map2json_emptyMap", test_map2json_emptyMap);
	TESTCALL("test_map2json_null", test_map2json_null);
	TESTCALL("test_map2json_true", test_map2json_true);
	TESTCALL("test_map2json_false", test_map2json_false);
	TESTCALL("test_map2json_numberInt", test_map2json_numberInt);
	TESTCALL("test_map2json_numberFloat", test_map2json_numberFloat);
	TESTCALL("test_map2json_array", test_map2json_array);
	TESTCALL("test_map2json_primitive", test_map2json_primitive);
	TESTCALL("test_map2json_deepNesting", test_map2json_deepNesting);
	TESTCALL("test_map2json_prefix", test_map2json_prefix);

	TESTCALL("test_json2map_emptyJson", test_json2map_emptyJson);
	TESTCALL("test_json2map_null", test_json2map_null);
	TESTCALL("test_json2map_true", test_json2map_true);
	TESTCALL("test_json2map_false", test_json2map_false);
	TESTCALL("test_json2map_numberInt", test_json2map_numberInt);
	TESTCALL("test_json2map_numberFloat", test_json2map_numberFloat);
	TESTCALL("test_json2map_array", test_json2map_array);
	TESTCALL("test_json2map_primitive", test_json2map_primitive);
	TESTCALL("test_json2map_deepNesting", test_json2map_deepNesting);
	TESTCALL("test_json2map_jsonNull", test_json2map_jsonNull);
	TESTCALL("test_json2map_noDataHook", test_json2map_noDataHook);
	TESTCALL("test_json2map_objectHook", test_json2map_objectHook);
	TESTCALL("test_json2map_prefix", test_json2map_prefix);

	return -1;
}